

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::BeginElemSegment
          (BinaryReaderInterp *this,Index index,Index table_index,uint8_t flags)

{
  initializer_list<wabt::Type> __l;
  SegmentMode index_00;
  bool bVar1;
  pointer *this_00;
  undefined1 local_220 [8];
  ElemDesc desc;
  Type local_178;
  iterator local_170;
  size_type local_168;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_160;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_148;
  undefined1 local_130 [8];
  FuncDesc init_func;
  Var local_98;
  Location local_50;
  Enum local_2c;
  SegmentMode local_28;
  uint8_t local_21;
  SegmentMode mode;
  Index IStack_1c;
  uint8_t flags_local;
  Index table_index_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_21 = flags;
  mode = table_index;
  IStack_1c = index;
  _table_index_local = this;
  local_28 = ToSegmentMode(flags);
  GetLocation(&local_50,this);
  index_00 = mode;
  GetLocation((Location *)
              &init_func.handlers.
               super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
  Var::Var(&local_98,index_00,
           (Location *)
           &init_func.handlers.
            super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_2c = (Enum)SharedValidator::OnElemSegment(&this->validator_,&local_50,&local_98,local_28);
  bVar1 = Failed((Result)local_2c);
  Var::~Var(&local_98);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    memset(&local_148,0,0x18);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_148);
    Type::Type(&local_178,I32);
    local_170 = &local_178;
    local_168 = 1;
    std::allocator<wabt::Type>::allocator
              ((allocator<wabt::Type> *)
               ((long)&desc.init_func.handlers.
                       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    __l._M_len = local_168;
    __l._M_array = local_170;
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              (&local_160,__l,
               (allocator_type *)
               ((long)&desc.init_func.handlers.
                       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    FuncType::FuncType((FuncType *)local_130,&local_148,&local_160);
    this_00 = &init_func.type.results.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    memset(this_00,0,0x18);
    std::vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>::vector
              ((vector<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_> *)this_00)
    ;
    init_func.locals.
    super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
    memset(&init_func.code_offset,0,0x18);
    std::vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>::vector
              ((vector<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_> *)
               &init_func.code_offset);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_160);
    std::allocator<wabt::Type>::~allocator
              ((allocator<wabt::Type> *)
               ((long)&desc.init_func.handlers.
                       super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_148);
    memset((vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_> *)local_220,0,
           0x18);
    std::vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>::vector
              ((vector<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_> *)local_220)
    ;
    Type::Type((Type *)&desc.elements.
                        super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,Void);
    desc.type.enum_ = local_28;
    desc.type.type_index_ = mode;
    FuncDesc::FuncDesc((FuncDesc *)&desc.mode,(FuncDesc *)local_130);
    std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::push_back
              (&this->module_->elems,(value_type *)local_220);
    Result::Result((Result *)((long)&this_local + 4),Ok);
    ElemDesc::~ElemDesc((ElemDesc *)local_220);
    FuncDesc::~FuncDesc((FuncDesc *)local_130);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginElemSegment(Index index,
                                            Index table_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnElemSegment(GetLocation(),
                                        Var(table_index, GetLocation()), mode));

  FuncDesc init_func{
      FuncType{{}, {ValueType::I32}}, {}, Istream::kInvalidOffset, {}};
  ElemDesc desc{{}, ValueType::Void, mode, table_index, init_func};
  module_.elems.push_back(desc);
  return Result::Ok;
}